

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O3

Var Js::JavascriptDate::EntryToJSON(RecyclableObject *function,CallInfo callInfo,...)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *this;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  Attributes attributes;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  JavascriptMethod p_Var9;
  PropertyRecord *pPVar10;
  ScriptContext *scriptContext;
  int in_stack_00000010;
  CallInfo local_60;
  CallInfo callInfo_local;
  ArgumentReader args;
  Var result;
  RecyclableObject *thisObj;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_60 = callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x4fc,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00bb91f3;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_60);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_60 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x4ff,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00bb91f3:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec41,L"Data.prototype.toJSON");
  }
  result = (Var)0x0;
  pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  scriptContext = pSVar2;
  BVar5 = JavascriptConversion::ToObject(pvVar7,pSVar2,(RecyclableObject **)&result);
  if (BVar5 == 0) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec42,L"Date.prototype.toJSON");
  }
  args.super_Arguments.Values = (Type)0x0;
  BVar5 = TryInvokeRemotely(EntryToJSON,scriptContext,(Arguments *)&callInfo_local,
                            &args.super_Arguments.Values);
  if (BVar5 != 0) {
    return args.super_Arguments.Values;
  }
  pvVar7 = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(result,pSVar2);
  if (((ulong)pvVar7 >> 0x32 != 0) &&
     (bVar4 = NumberUtilities::IsFinite((double)((ulong)pvVar7 ^ 0xfffc000000000000)), !bVar4)) {
    return (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           nullValue.ptr;
  }
  pvVar7 = JavascriptOperators::GetProperty
                     ((RecyclableObject *)result,0x16e,pSVar2,(PropertyValueInfo *)0x0);
  bVar4 = JavascriptConversion::IsCallable(pvVar7);
  if (!bVar4) {
    pPVar10 = ScriptContext::GetPropertyName(pSVar2,0x16e);
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec45,(PCWSTR)(pPVar10 + 1));
  }
  pRVar8 = VarTo<Js::RecyclableObject>(pvVar7);
  pvVar7 = result;
  this = pSVar2->threadContext;
  thisObj._7_1_ = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes(pRVar8);
  bVar4 = ThreadContext::HasNoSideEffect(this,pRVar8,attributes);
  if (bVar4) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar2->threadContext);
    if (pSVar2->threadContext->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
    CheckIsExecutable(pRVar8,p_Var9);
    p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
    pRVar8 = (RecyclableObject *)(*p_Var9)(pRVar8,(CallInfo)pRVar8,1,0,0,0,0,1,pvVar7);
    bVar4 = ThreadContext::IsOnStack(pRVar8);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      pRVar8 = (((((((((pRVar8->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
      goto LAB_00bb9165;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this->implicitCallFlags;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar2->threadContext);
      if (pSVar2->threadContext->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
      CheckIsExecutable(pRVar8,p_Var9);
      p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
      pRVar8 = (RecyclableObject *)(*p_Var9)(pRVar8,(CallInfo)pRVar8,1,0,0,0,0,1,pvVar7);
      this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00bb9165;
    }
    ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar2->threadContext);
    if (pSVar2->threadContext->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
    CheckIsExecutable(pRVar8,p_Var9);
    p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
    pRVar8 = (RecyclableObject *)(*p_Var9)(pRVar8,(CallInfo)pRVar8,1,0,0,0,0,1,pvVar7);
    bVar4 = ThreadContext::IsOnStack(pRVar8);
  }
  if (bVar4 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00bb9165:
  this->reentrancySafeOrHandled = (bool)thisObj._7_1_;
  return pRVar8;
}

Assistant:

Var JavascriptDate::EntryToJSON(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Data.prototype.toJSON"));
        }
        RecyclableObject* thisObj = nullptr;
        if (FALSE == JavascriptConversion::ToObject(args[0], scriptContext, &thisObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Date.prototype.toJSON"));
        }

        Var result = nullptr;
        if (TryInvokeRemotely(EntryToJSON, scriptContext, args, &result))
        {
            return result;
        }

        Var num = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(thisObj, scriptContext);
        if (JavascriptNumber::Is(num)
            && !NumberUtilities::IsFinite(JavascriptNumber::GetValue(num)))
        {
            return scriptContext->GetLibrary()->GetNull();
        }

        Var toISO = JavascriptOperators::GetProperty(thisObj, PropertyIds::toISOString, scriptContext, NULL);
        if (!JavascriptConversion::IsCallable(toISO))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::toISOString)->GetBuffer());
        }
        RecyclableObject* toISOFunc = VarTo<RecyclableObject>(toISO);
        return scriptContext->GetThreadContext()->ExecuteImplicitCall(toISOFunc, Js::ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(scriptContext->GetThreadContext(), toISOFunc, CallInfo(1), thisObj);
        });
    }